

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O2

void __thiscall OpenMD::MinimizerParameters::validate(MinimizerParameters *this)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  allocator<char> local_3ab;
  allocator<char> local_3aa;
  allocator<char> local_3a9;
  double local_3a8;
  EqualIgnoreCaseConstraint local_3a0;
  double local_360;
  double local_358;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_350;
  EqualIgnoreCaseConstraint local_2b0;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  EqualIgnoreCaseConstraint local_1d0;
  string local_190;
  string local_170;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_150;
  undefined8 local_50 [4];
  
  if ((this->Method).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"SD",(allocator<char> *)local_50);
    isEqualIgnoreCase(&local_3a0,&local_170);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"CG",&local_3aa);
    isEqualIgnoreCase(&local_2b0,&local_190);
    OpenMD::operator||(&local_350,
                       &local_3a0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_2b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"BFGS",&local_3ab);
    isEqualIgnoreCase(&local_1d0,&local_1f0);
    OpenMD::operator||(&local_150,
                       &local_350.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_1d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_210,(string *)&(this->Method).data_);
    bVar6 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_150,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_150);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint(&local_350);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_2b0);
    std::__cxx11::string::~string((string *)&local_190);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3a0);
    std::__cxx11::string::~string((string *)&local_170);
    if (!bVar6) {
      pcVar3 = (this->Method).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"SD",&local_3aa);
      isEqualIgnoreCase(&local_3a0,&local_230);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"CG",&local_3ab);
      isEqualIgnoreCase(&local_2b0,&local_250);
      OpenMD::operator||(&local_350,
                         &local_3a0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_2b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"BFGS",&local_3a9);
      isEqualIgnoreCase(&local_1d0,&local_270);
      OpenMD::operator||(&local_150,
                         &local_350.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_1d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string((string *)local_50,(string *)&local_150);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,local_50[0]);
      std::__cxx11::string::~string((string *)local_50);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_150);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_1d0);
      std::__cxx11::string::~string((string *)&local_270);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint(&local_350);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_2b0);
      std::__cxx11::string::~string((string *)&local_250);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3a0);
      std::__cxx11::string::~string((string *)&local_230);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->MaxIterations).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar1 = *(int *)&(this->MaxIterations).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)&local_150);
    if (iVar1 < 1) {
      pcVar3 = (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_150,(string *)&local_350);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_150.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_350);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->MaxStationaryStateIterations).super_ParameterBase.empty_ == false) {
    iVar1 = *(int *)&(this->MaxIterations).super_ParameterBase.field_0x2c;
    GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)&local_350,1);
    LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<int> *)&local_3a0,iVar1);
    operator&&((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                *)&local_150,(ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *)&local_350
               ,(ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)&local_3a0);
    iVar5 = (int)local_150.cons1_.cons1_.rhs_._M_string_length;
    iVar4 = (int)local_150.cons1_.cons1_.
                 super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                 _M_dataplus._M_p;
    iVar2 = *(int *)&(this->MaxStationaryStateIterations).super_ParameterBase.field_0x2c;
    AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
    ::~AndParamConstraint
              ((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                *)&local_150);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    if ((iVar2 < iVar4) || (iVar5 < iVar2)) {
      pcVar3 = (this->MaxStationaryStateIterations).super_ParameterBase.keyword_._M_dataplus._M_p;
      GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo((GreaterThanOrEqualTo<int> *)&local_350,1);
      LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<int> *)&local_3a0,iVar1);
      operator&&((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                  *)&local_150,
                 (ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *)&local_350,
                 (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)&local_3a0);
      std::__cxx11::string::string((string *)&local_2b0,(string *)&local_150);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_2b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_2b0);
      AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
      ::~AndParamConstraint
                ((AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                  *)&local_150);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_350);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->RootEpsilon).super_ParameterBase.empty_ == false) {
    isPositive();
    local_3a8 = (this->RootEpsilon).data_;
    std::__cxx11::string::~string((string *)&local_150);
    if (local_3a8 <= 0.0) {
      pcVar3 = (this->RootEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_150,(string *)&local_350);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_150.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_350);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->GradientNormEpsilon).super_ParameterBase.empty_ == false) {
    isPositive();
    local_3a8 = (this->GradientNormEpsilon).data_;
    std::__cxx11::string::~string((string *)&local_150);
    if (local_3a8 <= 0.0) {
      pcVar3 = (this->GradientNormEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&local_150,(string *)&local_350);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_150.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_350);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->InitialStepSize).super_ParameterBase.empty_ == false) {
    GreaterThanConstraint<double>::GreaterThanConstraint
              ((GreaterThanConstraint<double> *)&local_350,0.0);
    LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
              ((LessThanOrEqualToConstraint<double> *)&local_3a0,1.0);
    operator&&((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)&local_150,
               (ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)&local_350,
               (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)&local_3a0);
    local_3a8 = (this->InitialStepSize).data_;
    local_358 = (double)CONCAT44(local_150.cons1_.cons1_.
                                 super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                                 description_._M_dataplus._M_p._4_4_,
                                 (int)local_150.cons1_.cons1_.
                                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                                      .description_._M_dataplus._M_p);
    local_360 = (double)CONCAT44(local_150.cons1_.cons1_.rhs_._M_string_length._4_4_,
                                 (int)local_150.cons1_.cons1_.rhs_._M_string_length);
    AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
    ::~AndParamConstraint
              ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                *)&local_150);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_350);
    if ((local_3a8 <= local_358) || (local_360 < local_3a8)) {
      pcVar3 = (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p;
      GreaterThanConstraint<double>::GreaterThanConstraint
                ((GreaterThanConstraint<double> *)&local_350,0.0);
      LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
                ((LessThanOrEqualToConstraint<double> *)&local_3a0,1.0);
      operator&&((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                  *)&local_150,
                 (ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_> *)&local_350,
                 (ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)&local_3a0);
      std::__cxx11::string::string((string *)&local_2b0,(string *)&local_150);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_2b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_
               ._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_2b0);
      AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
      ::~AndParamConstraint
                ((AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
                  *)&local_150);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_350);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void MinimizerParameters::validate() {
    CheckParameter(Method, isEqualIgnoreCase("SD") || isEqualIgnoreCase("CG") ||
                               isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    int one       = 1;
    int mi        = this->getMaxIterations();
    RealType zero = 0.0;
    RealType oneR = 1.0;
    CheckParameter(MaxStationaryStateIterations,
                   isGreaterThanOrEqualTo(one) && isLessThanOrEqualTo(mi));
    CheckParameter(RootEpsilon, isPositive());
    CheckParameter(GradientNormEpsilon, isPositive());
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(oneR));
  }